

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

int __thiscall Fl_Help_View::get_align(Fl_Help_View *this,char *p,int a)

{
  int iVar1;
  char *pcVar2;
  char buf [255];
  char acStack_108 [256];
  
  pcVar2 = get_attr(this,p,"ALIGN",acStack_108,0xff);
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcasecmp(acStack_108,"CENTER");
    if (iVar1 == 0) {
      a = 0;
    }
    else {
      iVar1 = strcasecmp(acStack_108,"RIGHT");
      a = -(uint)(iVar1 == 0) | 1;
    }
  }
  return a;
}

Assistant:

int					// O - Alignment
Fl_Help_View::get_align(const char *p,	// I - Pointer to start of attrs
                        int        a)	// I - Default alignment
{
  char	buf[255];			// Alignment value


  if (get_attr(p, "ALIGN", buf, sizeof(buf)) == NULL)
    return (a);

  if (strcasecmp(buf, "CENTER") == 0)
    return (CENTER);
  else if (strcasecmp(buf, "RIGHT") == 0)
    return (RIGHT);
  else
    return (LEFT);
}